

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O1

void google::protobuf::internal::GenericSwap(Message *lhs,Message *rhs)

{
  int iVar1;
  LogMessage *pLVar2;
  ulong uVar3;
  undefined4 extraout_var;
  Reflection *this;
  Message *pMVar4;
  ulong uVar5;
  Message *pMVar6;
  LogFinisher local_99;
  LogMessage local_98;
  LogMessage local_60;
  Message *message1;
  
  uVar3 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 2) == 0) {
    if ((uVar3 & 1) != 0) {
      uVar3 = *(ulong *)(uVar3 & 0xfffffffffffffffc);
    }
  }
  else {
    uVar3 = 0;
  }
  uVar5 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 2) == 0) {
    if ((uVar5 & 1) != 0) {
      uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffc);
    }
  }
  else {
    uVar5 = 0;
  }
  if (uVar3 == uVar5) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x1a8);
    pLVar2 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: Arena::InternalHelper<Message>::GetOwningArena(lhs) != Arena::InternalHelper<Message>::GetOwningArena(rhs): "
                       );
    LogFinisher::operator=((LogFinisher *)&local_98,pLVar2);
    LogMessage::~LogMessage(&local_60);
  }
  uVar3 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 2) == 0) {
    if ((uVar3 & 1) != 0) {
      uVar3 = *(ulong *)(uVar3 & 0xfffffffffffffffc);
    }
  }
  else {
    uVar3 = 0;
  }
  if (uVar3 == 0) {
    uVar3 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar3 & 2) == 0) {
      if ((uVar3 & 1) != 0) {
        uVar3 = *(ulong *)(uVar3 & 0xfffffffffffffffc);
      }
    }
    else {
      uVar3 = 0;
    }
    if (uVar3 == 0) {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/reflection_ops.cc"
                 ,0x1aa);
      pLVar2 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: Arena::InternalHelper<Message>::GetOwningArena(lhs) != nullptr || Arena::InternalHelper<Message>::GetOwningArena(rhs) != nullptr: "
                         );
      LogFinisher::operator=(&local_99,pLVar2);
      LogMessage::~LogMessage(&local_98);
    }
  }
  uVar3 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 2) == 0) {
    if ((uVar3 & 1) != 0) {
      uVar3 = *(ulong *)(uVar3 & 0xfffffffffffffffc);
    }
  }
  else {
    uVar3 = 0;
  }
  pMVar4 = rhs;
  pMVar6 = lhs;
  if (uVar3 == 0) {
    uVar3 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
    pMVar4 = lhs;
    pMVar6 = rhs;
    if ((uVar3 & 2) == 0) {
      if ((uVar3 & 1) != 0) {
        uVar3 = *(ulong *)(uVar3 & 0xfffffffffffffffc);
      }
    }
    else {
      uVar3 = 0;
    }
  }
  iVar1 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[3])(pMVar4,uVar3);
  message1 = (Message *)CONCAT44(extraout_var,iVar1);
  (*(message1->super_MessageLite)._vptr_MessageLite[7])(message1,pMVar6);
  (*(pMVar6->super_MessageLite)._vptr_MessageLite[4])(pMVar6);
  (*(pMVar6->super_MessageLite)._vptr_MessageLite[7])(pMVar6,pMVar4);
  (*(pMVar4->super_MessageLite)._vptr_MessageLite[0x11])(pMVar4);
  Reflection::Swap(this,message1,pMVar4);
  return;
}

Assistant:

void GenericSwap(Message* lhs, Message* rhs) {
#ifndef PROTOBUF_FORCE_COPY_IN_SWAP
  GOOGLE_DCHECK(Arena::InternalHelper<Message>::GetOwningArena(lhs) !=
         Arena::InternalHelper<Message>::GetOwningArena(rhs));
  GOOGLE_DCHECK(Arena::InternalHelper<Message>::GetOwningArena(lhs) != nullptr ||
         Arena::InternalHelper<Message>::GetOwningArena(rhs) != nullptr);
#endif  // !PROTOBUF_FORCE_COPY_IN_SWAP
  // At least one of these must have an arena, so make `rhs` point to it.
  Arena* arena = Arena::InternalHelper<Message>::GetOwningArena(rhs);
  if (arena == nullptr) {
    std::swap(lhs, rhs);
    arena = Arena::InternalHelper<Message>::GetOwningArena(rhs);
  }

  // Improve efficiency by placing the temporary on an arena so that messages
  // are copied twice rather than three times.
  Message* tmp = rhs->New(arena);
  tmp->CheckTypeAndMergeFrom(*lhs);
  lhs->Clear();
  lhs->CheckTypeAndMergeFrom(*rhs);
#ifdef PROTOBUF_FORCE_COPY_IN_SWAP
  rhs->Clear();
  rhs->CheckTypeAndMergeFrom(*tmp);
  if (arena == nullptr) delete tmp;
#else   // PROTOBUF_FORCE_COPY_IN_SWAP
  rhs->GetReflection()->Swap(tmp, rhs);
#endif  // !PROTOBUF_FORCE_COPY_IN_SWAP
}